

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTruth.c
# Opt level: O1

void Map_TruthsCutOne(Map_Man_t *p,Map_Cut_t *pCut,uint *uTruth)

{
  char cVar1;
  Map_Cut_t *pMVar2;
  Map_NodeVec_t *pMVar3;
  Map_Node_t **ppMVar4;
  Map_Node_t *pMVar5;
  Map_Node_t *pMVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  uint uVar14;
  
  cVar1 = pCut->nLeaves;
  if (0 < (long)cVar1) {
    lVar8 = 0;
    do {
      pMVar2 = pCut->ppLeaves[lVar8]->pCuts;
      pMVar2->fMark = '\x01';
      pMVar2->M[0].uPhaseBest = p->uTruths[lVar8][0];
      pMVar2->M[1].uPhaseBest = p->uTruths[lVar8][1];
      lVar8 = lVar8 + 1;
    } while (cVar1 != lVar8);
  }
  if (pCut->fMark == '\0') {
    pMVar3 = p->vVisited;
    pMVar3->nSize = 0;
    Map_CutsCollect_rec(pCut,pMVar3);
    pMVar3 = p->vVisited;
    uVar11 = pMVar3->nSize;
    if (0 < (int)uVar11) {
      pCut->nVolume = (char)uVar11;
      cVar1 = pCut->nLeaves;
      if (0 < (long)cVar1) {
        lVar8 = 0;
        do {
          pCut->ppLeaves[lVar8]->pCuts->fMark = '\0';
          lVar8 = lVar8 + 1;
        } while (cVar1 != lVar8);
      }
      ppMVar4 = pMVar3->pArray;
      uVar9 = 1;
      if (1 < (int)uVar11) {
        uVar9 = (ulong)uVar11;
      }
      uVar10 = 0;
      do {
        pMVar5 = ppMVar4[uVar10];
        *(undefined1 *)((long)&pMVar5->p2 + 6) = 0;
        pMVar6 = pMVar5->pNext;
        if (((ulong)pMVar6 & 1) == 0) {
          uVar11 = *(uint *)((long)&pMVar6->pRepr + 4);
          fVar13 = pMVar6->tRequired[1].Rise;
        }
        else {
          uVar11 = ~*(uint *)(((ulong)pMVar6 & 0xfffffffffffffffe) + 0x5c);
          fVar13 = (float)~*(uint *)(((ulong)pMVar6 & 0xfffffffffffffffe) + 0x84);
        }
        uVar7 = *(ulong *)&pMVar5->Num;
        if ((uVar7 & 1) == 0) {
          uVar14 = *(uint *)(uVar7 + 0x5c);
          uVar12 = *(uint *)(uVar7 + 0x84);
        }
        else {
          uVar14 = ~*(uint *)((uVar7 & 0xfffffffffffffffe) + 0x5c);
          uVar12 = ~*(uint *)((uVar7 & 0xfffffffffffffffe) + 0x84);
        }
        if (*(char *)((long)&pMVar5->p2 + 7) == '\0') {
          *(uint *)((long)&pMVar5->pRepr + 4) = uVar14 & uVar11;
          fVar13 = (float)(uVar12 & (uint)fVar13);
        }
        else {
          *(uint *)((long)&pMVar5->pRepr + 4) = ~(uVar14 & uVar11);
          fVar13 = (float)~(uVar12 & (uint)fVar13);
        }
        pMVar5->tRequired[1].Rise = fVar13;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      *uTruth = *(uint *)((long)&pMVar5->pRepr + 4);
      uTruth[1] = (uint)pMVar5->tRequired[1].Rise;
      return;
    }
    __assert_fail("p->vVisited->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                  ,0xd7,"void Map_TruthsCutOne(Map_Man_t *, Map_Cut_t *, unsigned int *)");
  }
  __assert_fail("pCut->fMark == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                ,0xd2,"void Map_TruthsCutOne(Map_Man_t *, Map_Cut_t *, unsigned int *)");
}

Assistant:

void Map_TruthsCutOne( Map_Man_t * p, Map_Cut_t * pCut, unsigned uTruth[] )
{
    unsigned uTruth1[2], uTruth2[2];
    Map_Cut_t * pTemp = NULL; // Suppress "might be used uninitialized"
    int i;
    // mark the cut leaves
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pTemp = pCut->ppLeaves[i]->pCuts;
        pTemp->fMark = 1;
        pTemp->M[0].uPhaseBest = p->uTruths[i][0];
        pTemp->M[1].uPhaseBest = p->uTruths[i][1];
    }
    assert( pCut->fMark == 0 );

    // collect the cuts in the cut cone
    p->vVisited->nSize = 0;
    Map_CutsCollect_rec( pCut, p->vVisited );
    assert( p->vVisited->nSize > 0 );
    pCut->nVolume = p->vVisited->nSize;

    // compute the tables and unmark
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pTemp = pCut->ppLeaves[i]->pCuts;
        pTemp->fMark = 0;
    }
    for ( i = 0; i < p->vVisited->nSize; i++ )
    {
        // get the cut
        pTemp = (Map_Cut_t *)p->vVisited->pArray[i];
        pTemp->fMark = 0;
        // get truth table of the first branch
        if ( Map_CutIsComplement(pTemp->pOne) )
        {
            uTruth1[0] = ~Map_CutRegular(pTemp->pOne)->M[0].uPhaseBest;
            uTruth1[1] = ~Map_CutRegular(pTemp->pOne)->M[1].uPhaseBest;
        }
        else
        {
            uTruth1[0] = Map_CutRegular(pTemp->pOne)->M[0].uPhaseBest;
            uTruth1[1] = Map_CutRegular(pTemp->pOne)->M[1].uPhaseBest;
        }
        // get truth table of the second branch
        if ( Map_CutIsComplement(pTemp->pTwo) )
        {
            uTruth2[0] = ~Map_CutRegular(pTemp->pTwo)->M[0].uPhaseBest;
            uTruth2[1] = ~Map_CutRegular(pTemp->pTwo)->M[1].uPhaseBest;
        }
        else
        {
            uTruth2[0] = Map_CutRegular(pTemp->pTwo)->M[0].uPhaseBest;
            uTruth2[1] = Map_CutRegular(pTemp->pTwo)->M[1].uPhaseBest;
        }
        // get the truth table of the output
        if ( !pTemp->Phase )
        {
            pTemp->M[0].uPhaseBest = uTruth1[0] & uTruth2[0];
            pTemp->M[1].uPhaseBest = uTruth1[1] & uTruth2[1];
        }
        else
        {
            pTemp->M[0].uPhaseBest = ~(uTruth1[0] & uTruth2[0]);
            pTemp->M[1].uPhaseBest = ~(uTruth1[1] & uTruth2[1]);
        }
    }
    uTruth[0] = pTemp->M[0].uPhaseBest;
    uTruth[1] = pTemp->M[1].uPhaseBest;
}